

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall
cmState::AddDisallowedCommand
          (cmState *this,string *name,cmCommand *command,PolicyID policy,char *message)

{
  cmCommand *command_00;
  
  command_00 = (cmCommand *)operator_new(0x48);
  command_00->Makefile = (cmMakefile *)0x0;
  (command_00->Error)._M_dataplus._M_p = (pointer)&(command_00->Error).field_2;
  (command_00->Error)._M_string_length = 0;
  (command_00->Error).field_2._M_local_buf[0] = '\0';
  command_00->_vptr_cmCommand = (_func_int **)&PTR__cmDisallowedCommand_0069b9e0;
  command_00[1]._vptr_cmCommand = (_func_int **)command;
  *(PolicyID *)&command_00[1].Makefile = policy;
  command_00[1].Error._M_dataplus._M_p = message;
  AddBuiltinCommand(this,name,command_00);
  return;
}

Assistant:

void cmState::AddDisallowedCommand(std::string const& name, cmCommand* command,
                                   cmPolicies::PolicyID policy,
                                   const char* message)
{
  this->AddBuiltinCommand(name,
                          new cmDisallowedCommand(command, policy, message));
}